

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_avx2.c
# Opt level: O0

parasail_profile_t *
parasail_profile_create_stats_avx_256_64(char *s1,int _s1Len,parasail_matrix_t *matrix)

{
  parasail_matrix_t *in_RDX;
  int in_ESI;
  char *in_RDI;
  __m256i_64_t s;
  __m256i_64_t m;
  __m256i_64_t p;
  parasail_profile_t *profile;
  int32_t index;
  __m256i *vProfileS;
  __m256i *vProfileM;
  __m256i *vProfile;
  int32_t segLen;
  int32_t segWidth;
  int32_t n;
  int32_t segNum;
  int32_t k;
  int32_t j;
  int32_t i;
  int s1Len;
  uint local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  longlong local_1c0 [4];
  longlong local_1a0 [4];
  longlong local_180 [7];
  parasail_profile_t *local_148;
  int local_13c;
  __m256i *local_138;
  __m256i *local_130;
  __m256i *local_128;
  int local_120;
  undefined4 local_11c;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  parasail_matrix_t *local_100;
  char *local_f0;
  parasail_profile_t *local_e8;
  longlong local_e0;
  longlong lStack_d8;
  longlong lStack_d0;
  longlong lStack_c8;
  __m256i *local_a8;
  longlong local_a0;
  longlong lStack_98;
  longlong lStack_90;
  longlong lStack_88;
  __m256i *local_68;
  longlong local_60;
  longlong lStack_58;
  longlong lStack_50;
  longlong lStack_48;
  __m256i *local_38;
  
  local_104 = 0;
  local_108 = 0;
  local_10c = 0;
  local_110 = 0;
  local_114 = 0;
  local_118 = 0;
  local_11c = 4;
  local_120 = 0;
  local_128 = (__m256i *)0x0;
  local_130 = (__m256i *)0x0;
  local_138 = (__m256i *)0x0;
  local_13c = 0;
  local_148 = (parasail_profile_t *)0x0;
  if (in_RDX == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_profile_create_stats_avx_256_64","matrix");
    local_e8 = (parasail_profile_t *)0x0;
  }
  else if (in_RDI == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_profile_create_stats_avx_256_64","s1");
    local_e8 = (parasail_profile_t *)0x0;
  }
  else {
    local_1c4 = in_ESI;
    if (in_RDX->type != 0) {
      local_1c4 = in_RDX->length;
    }
    local_104 = local_1c4;
    local_118 = in_RDX->size;
    local_120 = (local_1c4 + 3) / 4;
    local_100 = in_RDX;
    local_f0 = in_RDI;
    local_128 = parasail_memalign___m256i(0x20,(long)(local_118 * local_120));
    if (local_128 == (__m256i *)0x0) {
      local_e8 = (parasail_profile_t *)0x0;
    }
    else {
      local_130 = parasail_memalign___m256i(0x20,(long)(local_118 * local_120));
      if (local_130 == (__m256i *)0x0) {
        local_e8 = (parasail_profile_t *)0x0;
      }
      else {
        local_138 = parasail_memalign___m256i(0x20,(long)(local_118 * local_120));
        if (local_138 == (__m256i *)0x0) {
          local_e8 = (parasail_profile_t *)0x0;
        }
        else {
          local_148 = parasail_profile_new(local_f0,local_104,local_100);
          if (local_148 == (parasail_profile_t *)0x0) {
            local_e8 = (parasail_profile_t *)0x0;
          }
          else {
            for (local_110 = 0; local_110 < local_118; local_110 = local_110 + 1) {
              for (local_108 = 0; local_108 < local_120; local_108 = local_108 + 1) {
                local_10c = local_108;
                for (local_114 = 0; local_114 < 4; local_114 = local_114 + 1) {
                  if (local_100->type == 0) {
                    if (local_10c < local_104) {
                      local_1c8 = local_100->matrix
                                  [local_118 * local_110 +
                                   local_100->mapper[(byte)local_f0[local_10c]]];
                    }
                    else {
                      local_1c8 = 0;
                    }
                    local_180[local_114] = (long)local_1c8;
                  }
                  else {
                    if (local_10c < local_104) {
                      local_1cc = local_100->matrix
                                  [local_118 * local_10c +
                                   local_100->mapper[(byte)local_100->alphabet[local_110]]];
                    }
                    else {
                      local_1cc = 0;
                    }
                    local_180[local_114] = (long)local_1cc;
                  }
                  if (local_10c < local_104) {
                    local_1d0 = (uint)(local_110 == local_100->mapper[(byte)local_f0[local_10c]]);
                  }
                  else {
                    local_1d0 = 0;
                  }
                  local_1a0[local_114] = (long)(int)local_1d0;
                  local_1c0[local_114] = (long)(int)(uint)(0 < local_180[local_114]);
                  local_10c = local_120 + local_10c;
                }
                local_38 = local_128 + local_13c;
                local_60 = local_180[0];
                lStack_58 = local_180[1];
                lStack_50 = local_180[2];
                lStack_48 = local_180[3];
                (*local_38)[0] = local_180[0];
                (*local_38)[1] = local_180[1];
                (*local_38)[2] = local_180[2];
                (*local_38)[3] = local_180[3];
                local_68 = local_130 + local_13c;
                local_a0 = local_1a0[0];
                lStack_98 = local_1a0[1];
                lStack_90 = local_1a0[2];
                lStack_88 = local_1a0[3];
                (*local_68)[0] = local_1a0[0];
                (*local_68)[1] = local_1a0[1];
                (*local_68)[2] = local_1a0[2];
                (*local_68)[3] = local_1a0[3];
                local_a8 = local_138 + local_13c;
                local_e0 = local_1c0[0];
                lStack_d8 = local_1c0[1];
                lStack_d0 = local_1c0[2];
                lStack_c8 = local_1c0[3];
                (*local_a8)[0] = local_1c0[0];
                (*local_a8)[1] = local_1c0[1];
                (*local_a8)[2] = local_1c0[2];
                (*local_a8)[3] = local_1c0[3];
                local_13c = local_13c + 1;
              }
            }
            (local_148->profile64).score = local_128;
            (local_148->profile64).matches = local_130;
            (local_148->profile64).similar = local_138;
            local_148->free = parasail_free___m256i;
            local_e8 = local_148;
          }
        }
      }
    }
  }
  return local_e8;
}

Assistant:

parasail_profile_t * parasail_profile_create_stats_avx_256_64(
        const char * const restrict s1, const int _s1Len,
        const parasail_matrix_t *matrix)
{
    int s1Len = 0;
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    int32_t n = 0;
    const int32_t segWidth = 4; /* number of values in vector unit */
    int32_t segLen = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict vProfileM = NULL;
    __m256i* restrict vProfileS = NULL;
    int32_t index = 0;
    parasail_profile_t *profile = NULL;

    PARASAIL_CHECK_NULL(matrix);
    /* s1 is required for both pssm and square */
    PARASAIL_CHECK_NULL(s1);

    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    n = matrix->size; /* number of amino acids in table */
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = parasail_memalign___m256i(32, n * segLen);
    if (!vProfile) return NULL;
    vProfileM = parasail_memalign___m256i(32, n * segLen);
    if (!vProfileM) return NULL;
    vProfileS = parasail_memalign___m256i(32, n * segLen);
    if (!vProfileS) return NULL;
    profile = parasail_profile_new(s1, s1Len, matrix);
    if (!profile) return NULL;

    for (k=0; k<n; ++k) {
        for (i=0; i<segLen; ++i) {
            __m256i_64_t p;
            __m256i_64_t m;
            __m256i_64_t s;
            j = i;
            for (segNum=0; segNum<segWidth; ++segNum) {
                if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
                    p.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*k+matrix->mapper[(unsigned char)s1[j]]];
                }
                else {
                    p.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*j+matrix->mapper[(unsigned char)matrix->alphabet[k]]];
                }
                m.v[segNum] = j >= s1Len ? 0 : (k == matrix->mapper[(unsigned char)s1[j]]);
                s.v[segNum] = p.v[segNum] > 0;
                j += segLen;
            }
            _mm256_store_si256(&vProfile[index], p.m);
            _mm256_store_si256(&vProfileM[index], m.m);
            _mm256_store_si256(&vProfileS[index], s.m);
            ++index;
        }
    }

    profile->profile64.score = vProfile;
    profile->profile64.matches = vProfileM;
    profile->profile64.similar = vProfileS;
    profile->free = &parasail_free___m256i;
    return profile;
}